

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

int pack_bs_worker_hook(void *arg1,void *arg2)

{
  int iVar1;
  AV1_COMP *cpi;
  pthread_mutex_t *__mutex;
  ThreadData_conflict *td;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  cpi = *arg1;
  iVar3 = (cpi->common).tiles.rows;
  iVar1 = (cpi->common).tiles.cols;
  __mutex = (cpi->mt_info).pack_bs_sync.mutex_;
  *(long *)(*(long *)((long)arg1 + 8) + 0x2b90) = (long)arg1 + 0x18;
  iVar2 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  if (iVar2 == 0) {
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
    while( true ) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      uVar4 = 0xffffffff;
      if ((cpi->mt_info).pack_bs_sync.pack_bs_mt_exit == false) {
        iVar2 = (cpi->mt_info).pack_bs_sync.next_job_idx;
        if (iVar2 != iVar3 * iVar1) {
          (cpi->mt_info).pack_bs_sync.next_job_idx = iVar2 + 1;
          uVar4 = (uint)(cpi->mt_info).pack_bs_sync.pack_bs_tile_order[iVar2].tile_idx;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (uVar4 == 0xffffffff) break;
      td = *(ThreadData_conflict **)((long)arg1 + 8);
      (td->mb).e_mbd.tile_ctx = &cpi->tile_data[uVar4].tctx;
      av1_pack_tile_info(cpi,td,(PackBSParams *)((ulong)uVar4 * 0x58 + (long)arg2));
    }
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    iVar3 = 1;
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    (cpi->mt_info).pack_bs_sync.pack_bs_mt_exit = true;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int pack_bs_worker_hook(void *arg1, void *arg2) {
  EncWorkerData *const thread_data = (EncWorkerData *)arg1;
  PackBSParams *const pack_bs_params = (PackBSParams *)arg2;
  AV1_COMP *const cpi = thread_data->cpi;
  AV1_COMMON *const cm = &cpi->common;
  AV1EncPackBSSync *const pack_bs_sync = &cpi->mt_info.pack_bs_sync;
  const CommonTileParams *const tiles = &cm->tiles;
  const int num_tiles = tiles->cols * tiles->rows;

#if CONFIG_MULTITHREAD
  pthread_mutex_t *const pack_bs_mutex = pack_bs_sync->mutex_;
#endif
  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  xd->error_info = error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pack_bs_mutex);
    pack_bs_sync->pack_bs_mt_exit = true;
    pthread_mutex_unlock(pack_bs_mutex);
#endif
    return 0;
  }
  error_info->setjmp = 1;

  while (1) {
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pack_bs_mutex);
#endif
    const int tile_idx =
        pack_bs_sync->pack_bs_mt_exit
            ? -1
            : get_next_pack_bs_tile_idx(pack_bs_sync, num_tiles);
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(pack_bs_mutex);
#endif
    // When pack_bs_mt_exit is set to true, other workers need not pursue any
    // further jobs.
    if (tile_idx == -1) break;
    TileDataEnc *this_tile = &cpi->tile_data[tile_idx];
    thread_data->td->mb.e_mbd.tile_ctx = &this_tile->tctx;

    av1_pack_tile_info(cpi, thread_data->td, &pack_bs_params[tile_idx]);
  }

  error_info->setjmp = 0;
  return 1;
}